

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O1

void Acb_NtkUpdateTiming(Acb_Ntk_t *p,int iObj)

{
  int iVar1;
  int iVar2;
  Vec_Que_t *pVVar3;
  int *piVar4;
  bool bVar5;
  Vec_Int_t *vTfi;
  Vec_Int_t *vTfo;
  ulong uVar6;
  long lVar7;
  
  iVar1 = p->LevelMax;
  vTfi = Acb_ObjCollectTfi(p,iObj,1);
  vTfo = Acb_ObjCollectTfo(p,iObj,1);
  if (0 < iObj) {
    if ((long)vTfi->nSize < 1) {
LAB_003b21a6:
      __assert_fail("p->nSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
    }
    if (vTfi->pArray[(long)vTfi->nSize + -1] != iObj) {
      __assert_fail("Vec_IntEntryLast(vTfi) == iObj",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbUtil.c"
                    ,0x243,"void Acb_NtkUpdateTiming(Acb_Ntk_t *, int)");
    }
    iVar2 = vTfo->nSize;
    if ((long)iVar2 < 1) goto LAB_003b21a6;
    if (vTfo->pArray[(long)iVar2 + -1] != iObj) {
      __assert_fail("Vec_IntEntryLast(vTfo) == iObj",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbUtil.c"
                    ,0x244,"void Acb_NtkUpdateTiming(Acb_Ntk_t *, int)");
    }
    vTfo->nSize = iVar2 + -1;
  }
  Acb_NtkComputeLevelD(p,vTfo);
  iVar2 = p->LevelMax;
  Acb_NtkComputeLevelR(p,vTfi);
  if (iVar2 != p->LevelMax) {
    __assert_fail("LevelD == LevelR",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbUtil.c"
                  ,0x24b,"void Acb_NtkUpdateTiming(Acb_Ntk_t *, int)");
  }
  if (0 < iObj) {
    bVar5 = true;
    if (iVar1 <= p->LevelMax) goto LAB_003b20d5;
    vTfi = Acb_ObjCollectTfi(p,-1,1);
    vTfo = Acb_ObjCollectTfo(p,-1,1);
    pVVar3 = p->vQue;
    piVar4 = pVVar3->pHeap;
    if (*piVar4 != -1) {
      __assert_fail("p->pHeap[0] == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecQue.h"
                    ,0x71,"void Vec_QueClear(Vec_Que_t *)");
    }
    if (1 < pVVar3->nSize) {
      uVar6 = 1;
      do {
        lVar7 = (long)piVar4[uVar6];
        if ((lVar7 < 0) || (uVar6 != (uint)pVVar3->pOrder[lVar7])) {
          __assert_fail("p->pHeap[i] >= 0 && p->pOrder[p->pHeap[i]] == i",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecQue.h"
                        ,0x74,"void Vec_QueClear(Vec_Que_t *)");
        }
        pVVar3->pOrder[lVar7] = -1;
        piVar4[uVar6] = -1;
        uVar6 = uVar6 + 1;
      } while ((long)uVar6 < (long)pVVar3->nSize);
    }
    pVVar3->nSize = 1;
  }
  bVar5 = false;
LAB_003b20d5:
  if (bVar5) {
    Acb_NtkComputePathsD(p,vTfi,0);
  }
  Acb_NtkComputePathsD(p,vTfo,1);
  iVar1 = p->nPaths;
  if (bVar5) {
    Acb_NtkComputePathsR(p,vTfo,0);
  }
  Acb_NtkComputePathsR(p,vTfi,1);
  if (iVar1 == p->nPaths) {
    if (0 < vTfi->nSize) {
      lVar7 = 0;
      do {
        Acb_ObjUpdatePriority(p,vTfi->pArray[lVar7]);
        lVar7 = lVar7 + 1;
      } while (lVar7 < vTfi->nSize);
    }
    if ((bVar5) && (0 < vTfo->nSize)) {
      lVar7 = 0;
      do {
        Acb_ObjUpdatePriority(p,vTfo->pArray[lVar7]);
        lVar7 = lVar7 + 1;
      } while (lVar7 < vTfo->nSize);
    }
    return;
  }
  __assert_fail("nPaths1 == nPaths2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbUtil.c"
                ,0x25c,"void Acb_NtkUpdateTiming(Acb_Ntk_t *, int)");
}

Assistant:

void Acb_NtkUpdateTiming( Acb_Ntk_t * p, int iObj )
{
    int i, Entry, LevelMax = p->LevelMax;
    int LevelD, LevelR, nPaths1, nPaths2;
    // assuming that direct level of the new nodes (including iObj) is up to date
    Vec_Int_t * vTfi = Acb_ObjCollectTfi( p, iObj, 1 );
    Vec_Int_t * vTfo = Acb_ObjCollectTfo( p, iObj, 1 );
    if ( iObj > 0 )
    {
        assert( Vec_IntEntryLast(vTfi) == iObj );
        assert( Vec_IntEntryLast(vTfo) == iObj );
        Vec_IntPop( vTfo );
    }
    Acb_NtkComputeLevelD( p, vTfo );
    LevelD = p->LevelMax;
    Acb_NtkComputeLevelR( p, vTfi );
    LevelR = p->LevelMax;
    assert( LevelD == LevelR );
    if ( iObj > 0 && LevelMax > p->LevelMax ) // reduced level
    {
        iObj = -1;
        vTfi = Acb_ObjCollectTfi( p, -1, 1 );
        vTfo = Acb_ObjCollectTfo( p, -1, 1 );   
        Vec_QueClear( p->vQue );
        // add backup here
    }
    if ( iObj > 0 )
    Acb_NtkComputePathsD( p, vTfi, 0 );
    Acb_NtkComputePathsD( p, vTfo, 1 );
    nPaths1 = p->nPaths;
    if ( iObj > 0 )
    Acb_NtkComputePathsR( p, vTfo, 0 );
    Acb_NtkComputePathsR( p, vTfi, 1 );
    nPaths2 = p->nPaths;
    assert( nPaths1 == nPaths2 );
    Vec_IntForEachEntry( vTfi, Entry, i )
        Acb_ObjUpdatePriority( p, Entry );
    if ( iObj > 0 )
    Vec_IntForEachEntry( vTfo, Entry, i )
        Acb_ObjUpdatePriority( p, Entry );

//    printf( "Updating timing for object %d.\n", iObj );
//    Acb_NtkPrintPaths( p );
//    while ( (Entry = (int)Vec_QueTopPriority(p->vQue)) > 0 )
//        printf( "Obj = %5d : Prio = %d.\n", Vec_QuePop(p->vQue), Entry );
}